

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_encode_sb_row(AV1_COMP *cpi,ThreadData_conflict *td,int tile_row,int tile_col,int mi_row)

{
  int in_EDX;
  undefined8 in_RSI;
  TileInfo *in_RDI;
  undefined4 in_R8D;
  TokenExtra *tok;
  TileInfo *tile_info;
  TileDataEnc *this_tile;
  int tile_cols;
  AV1_COMMON *cm;
  TokenExtra **in_stack_00000080;
  int in_stack_0000008c;
  TileDataEnc *in_stack_00000090;
  ThreadData_conflict *in_stack_00000098;
  AV1_COMP *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffe0;
  
  get_token_start((AV1_COMP *)tok,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,
                  (TokenExtra **)CONCAT44(in_R8D,in_stack_ffffffffffffffe0));
  encode_sb_row(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                in_stack_00000080);
  populate_token_count
            ((AV1_COMP *)tok,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,
             (TokenExtra *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void av1_encode_sb_row(AV1_COMP *cpi, ThreadData *td, int tile_row,
                       int tile_col, int mi_row) {
  AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  TileDataEnc *this_tile = &cpi->tile_data[tile_row * tile_cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;
  TokenExtra *tok = NULL;

  get_token_start(cpi, tile_info, tile_row, tile_col, mi_row, &tok);

  encode_sb_row(cpi, td, this_tile, mi_row, &tok);

  populate_token_count(cpi, tile_info, tile_row, tile_col, mi_row, tok);
}